

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

Instr * __thiscall
LowererMD::LoadInputParamCount(LowererMD *this,Instr *instrInsert,int adjust,bool needFlags)

{
  SymOpnd *src1Opnd;
  StackSym *sym;
  RegOpnd *dstOpnd_00;
  Instr *pIVar1;
  IntConstOpnd *pIVar2;
  SymOpnd *srcOpnd;
  RegOpnd *dstOpnd;
  Instr *instr;
  bool needFlags_local;
  int adjust_local;
  Instr *instrInsert_local;
  LowererMD *this_local;
  
  src1Opnd = Lowerer::LoadCallInfo(instrInsert);
  sym = StackSym::New(TyInt64,this->m_func);
  dstOpnd_00 = IR::RegOpnd::New(sym,TyInt64,this->m_func);
  pIVar1 = IR::Instr::New(MOV,&dstOpnd_00->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instrInsert,pIVar1);
  pIVar2 = IR::IntConstOpnd::New(0xffffff,TyInt64,this->m_func,true);
  pIVar1 = IR::Instr::New(AND,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,&pIVar2->super_Opnd,
                          this->m_func);
  IR::Instr::InsertBefore(instrInsert,pIVar1);
  pIVar2 = IR::IntConstOpnd::New((long)-adjust,TyInt64,this->m_func,false);
  pIVar1 = Lowerer::InsertSub(true,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,
                              &pIVar2->super_Opnd,instrInsert);
  return pIVar1;
}

Assistant:

IR::Instr *
LowererMD::LoadInputParamCount(IR::Instr * instrInsert, int adjust, bool needFlags)
{
    IR::Instr *   instr;
    IR::RegOpnd * dstOpnd;
    IR::SymOpnd * srcOpnd;

    srcOpnd = Lowerer::LoadCallInfo(instrInsert);
    dstOpnd = IR::RegOpnd::New(StackSym::New(TyMachReg, this->m_func), TyMachReg, this->m_func);
    instr = IR::Instr::New(Js::OpCode::MOV, dstOpnd, srcOpnd, this->m_func);
    instrInsert->InsertBefore(instr);

    // Copy the callinfo before masking off the param count

    Assert(Js::CallInfo::ksizeofCount == 24);

    // Mask off call flags from callinfo
    instr = IR::Instr::New(Js::OpCode::AND, dstOpnd, dstOpnd,
        IR::IntConstOpnd::New(0x00FFFFFF, TyMachReg, this->m_func, true), this->m_func);
    instrInsert->InsertBefore(instr);

    instr = m_lowerer->InsertSub(true, dstOpnd, dstOpnd, IR::IntConstOpnd::New(-adjust, TyMachReg, this->m_func), instrInsert);

    return instr;
}